

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateCppModuleUniqueHandleUsings_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  pointer pFVar1;
  pointer pEVar2;
  char *this_00;
  FeatureData *feature;
  pointer title;
  pointer pEVar3;
  anon_class_16_2_7e9d40f7 generateUsingsAndProtection;
  string usingTemplate;
  string local_c0;
  anon_class_16_2_7e9d40f7 local_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"  using VULKAN_HPP_NAMESPACE::Unique${handleName};\n",
             (allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "\n  //======================\n  //=== UNIQUE HANDLEs ===\n  //======================\n"
             ,(allocator<char> *)&local_90);
  this_00 = "VULKAN_HPP_NO_SMART_HANDLE";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"VULKAN_HPP_NO_SMART_HANDLE",(allocator<char> *)&local_a0);
  generateProtection(&local_90,(VulkanHppGenerator *)this_00,&local_c0,false);
  std::__cxx11::string::~string((string *)&local_c0);
  std::operator+(&local_c0,"\n",&local_90.first);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  pFVar1 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a0.usingTemplate = &local_50;
  local_a0.this = this;
  for (title = (this->m_features).
               super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
               ._M_impl.super__Vector_impl_data._M_start; title != pFVar1; title = title + 1) {
    generateCppModuleUniqueHandleUsings::anon_class_16_2_7e9d40f7::operator()
              (&local_c0,&local_a0,&title->requireData,&title->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  pEVar2 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar3 = (this->m_extensions).
                super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar2; pEVar3 = pEVar3 + 1) {
    generateCppModuleUniqueHandleUsings::anon_class_16_2_7e9d40f7::operator()
              (&local_c0,&local_a0,&pEVar3->requireData,&pEVar3->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"  using VULKAN_HPP_NAMESPACE::UniqueHandleTraits;\n");
  std::operator+(&local_c0,&local_90.second,"\n");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCppModuleUniqueHandleUsings() const
{
  auto const usingTemplate                        = std::string{ R"(  using VULKAN_HPP_NAMESPACE::Unique${handleName};
)" };
  auto       uniqueHandleUsings                   = std::string{ R"(
  //======================
  //=== UNIQUE HANDLEs ===
  //======================
)" };
  auto const [smartHandleEnter, smartHandleLeave] = generateProtection( "VULKAN_HPP_NO_SMART_HANDLE", false );

  uniqueHandleUsings += "\n" + smartHandleEnter;

  auto const generateUsingsAndProtection = [&usingTemplate, this]( std::vector<RequireData> const & requireData, std::string const & title )
  {
    auto usings = std::string{};
    for ( auto const & require : requireData )
    {
      for ( auto const & type : require.types )
      {
        if ( auto const & handleIt = m_handles.find( type.name ); handleIt != m_handles.end() && !handleIt->second.deleteCommand.empty() )
        {
          usings += replaceWithMap( usingTemplate, { { "handleName", stripPrefix( handleIt->first, "Vk" ) } } );
        }
      }
    }
    return addTitleAndProtection( title, usings );
  };

  for ( auto const & feature : m_features )
  {
    uniqueHandleUsings += generateUsingsAndProtection( feature.requireData, feature.name );
  }

  for ( auto const & extension : m_extensions )
  {
    uniqueHandleUsings += generateUsingsAndProtection( extension.requireData, extension.name );
  }

  uniqueHandleUsings += R"(  using VULKAN_HPP_NAMESPACE::UniqueHandleTraits;
)";

  uniqueHandleUsings += smartHandleLeave + "\n";

  return uniqueHandleUsings;
}